

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteGeneric<long,long,long,long,duckdb::TernaryLambdaWrapper,long(*)(long,long,long)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_long_long_long_long *fun)

{
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  SelectionVector *asel;
  long *count_00;
  long *result_data_00;
  long *cdata_00;
  ValidityMask *cvalidity;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat cdata_1;
  UnifiedVectorFormat bdata_1;
  UnifiedVectorFormat adata_1;
  ValidityMask *result_validity;
  long *result_data;
  long *cdata;
  long *bdata;
  long *adata;
  idx_t in_stack_fffffffffffffdf8;
  ValidityMask *in_stack_fffffffffffffe00;
  long in_stack_fffffffffffffe08;
  long in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  _func_long_long_long_long *in_stack_fffffffffffffe20;
  SelectionVector *csel;
  ValidityMask *avalidity;
  ValidityMask *bvalidity;
  UnifiedVectorFormat *in_stack_fffffffffffffe98;
  SelectionVector *result_validity_00;
  _func_long_long_long_long *in_stack_fffffffffffffea0;
  ValidityMask local_158 [2];
  UnifiedVectorFormat local_110 [16];
  ValidityMask local_100;
  long *local_c8 [2];
  SelectionVector local_b8 [56];
  ValidityMask *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  UnifiedVectorFormat *local_50;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (((VVar1 == CONSTANT_VECTOR) &&
      (VVar1 = Vector::GetVectorType(local_38), VVar1 == CONSTANT_VECTOR)) &&
     (VVar1 = Vector::GetVectorType(local_40), VVar1 == CONSTANT_VECTOR)) {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    bVar2 = ConstantVector::IsNull((Vector *)0x4e329e);
    if (((bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0x4e32af), bVar2)) ||
       (bVar2 = ConstantVector::IsNull((Vector *)0x4e32c0), bVar2)) {
      duckdb::ConstantVector::SetNull(local_48,true);
    }
    else {
      local_60 = ConstantVector::GetData<long>((Vector *)0x4e32ea);
      local_68 = ConstantVector::GetData<long>((Vector *)0x4e32ff);
      local_70 = ConstantVector::GetData<long>((Vector *)0x4e3314);
      local_78 = ConstantVector::GetData<long>((Vector *)0x4e3329);
      local_80 = ConstantVector::Validity(local_48);
      lVar3 = TernaryLambdaWrapper::Operation<long(*)(long,long,long),long,long,long,long>
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *local_78 = lVar3;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_110);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xfffffffffffffe98);
    duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_38,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_40,local_50);
    asel = (SelectionVector *)UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)local_c8);
    count_00 = UnifiedVectorFormat::GetData<long>(local_110);
    result_data_00 =
         UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&stack0xfffffffffffffe98);
    cdata_00 = FlatVector::GetData<long>((Vector *)0x4e346e);
    csel = local_b8;
    avalidity = &local_100;
    bvalidity = local_158;
    result_validity_00 = (SelectionVector *)in_stack_fffffffffffffe98;
    cvalidity = FlatVector::Validity((Vector *)0x4e34e4);
    ExecuteLoop<long,long,long,long,duckdb::TernaryLambdaWrapper,long(*)(long,long,long)>
              (local_c8[0],(long *)local_50,cdata_00,result_data_00,(idx_t)count_00,asel,
               (SelectionVector *)in_stack_fffffffffffffe98,csel,avalidity,bvalidity,cvalidity,
               (ValidityMask *)result_validity_00,in_stack_fffffffffffffea0);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe98);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe98);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe98);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}